

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedBrs::optimizeGC::Optimizer::Optimizer(Optimizer *this)

{
  Optimizer *this_local;
  
  PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::PostWalker
            (&this->super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>);
  this->worked = false;
  return;
}

Assistant:

void visitBrOn(BrOn* curr) {
        // Ignore unreachable BrOns which we cannot improve anyhow. Note that
        // we must check the ref field manually, as we may be changing types as
        // we go here. (Another option would be to use a TypeUpdater here
        // instead of calling ReFinalize at the very end, but that would be more
        // complex and slower.)
        if (curr->type == Type::unreachable ||
            curr->ref->type == Type::unreachable) {
          return;
        }

        // First, check for a possible null which would prevent optimizations on
        // null checks.
        // TODO: Look into using BrOnNonNull here, to replace a br_on_func whose
        // input is (ref null func) with br_on_non_null (as only the null check
        // would be needed).
        // TODO: Use the fallthrough to determine in more cases that we
        // definitely have a null.
        auto refType = curr->ref->type;
        if (refType.isNullable() &&
            (curr->op == BrOnNull || curr->op == BrOnNonNull)) {
          return;
        }

        if (curr->op == BrOnNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is never taken, and the non-null
          // value flows through.
          replaceCurrent(curr->ref);
          worked = true;
          return;
        }
        if (curr->op == BrOnNonNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
          return;
        }

        // Check if the type is the kind we are checking for.
        auto result = GCTypeUtils::evaluateCastCheck(refType, curr->castType);
        if (curr->op == BrOnCastFail) {
          result = GCTypeUtils::flipEvaluationResult(result);
        }

        if (result == GCTypeUtils::Success) {
          // The cast succeeds, so we can switch from BrOn to a simple br that
          // is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
        } else if (result == GCTypeUtils::Failure) {
          // The cast fails, so the branch is never taken, and the value just
          // flows through.
          replaceCurrent(curr->ref);
          worked = true;
        }
        // TODO: Handle SuccessOnlyIfNull and SuccessOnlyIfNonNull.
      }